

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void update_stats(AV1_COMMON *cm,ThreadData_conflict *td)

{
  aom_cdf_prob *paVar1;
  MACROBLOCKD *xd;
  char cVar2;
  uint8_t uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  MB_MODE_INFO *mbmi;
  FRAME_CONTEXT *fc;
  MB_MODE_INFO *pMVar9;
  MB_MODE_INFO *pMVar10;
  FRAME_CONTEXT *pFVar11;
  scale_factors *psVar12;
  short sVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  byte bVar18;
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  uint16_t *puVar23;
  MV *pMVar24;
  byte bVar25;
  undefined8 unaff_RBP;
  undefined7 uVar27;
  undefined8 uVar26;
  char cVar28;
  char cVar29;
  long lVar30;
  aom_cdf_prob (*paaVar31) [3];
  int8_t ref_idx_1;
  undefined8 uVar32;
  MvSubpelPrecision precision;
  bool bVar33;
  MOTION_MODE val;
  int_mv dv_ref;
  int_mv local_54;
  undefined8 local_50;
  undefined8 local_48;
  ulong local_40;
  FRAME_COUNTS *local_38;
  
  mbmi = *(td->mb).e_mbd.mi;
  uVar22 = (ulong)mbmi->bsize;
  if ((cm->seg).enabled == '\0') {
    bVar25 = 0;
    uVar27 = 0;
  }
  else {
    uVar17 = CONCAT71((int7)((ulong)unaff_RBP >> 8),
                      (char)(cm->seg).feature_mask[mbmi->field_0xa7 & 7]) & 0xffffffffffffff20;
    uVar27 = (undefined7)(uVar17 >> 8);
    bVar25 = (byte)uVar17 >> 5;
  }
  fc = (td->mb).e_mbd.tile_ctx;
  if (((cm->current_frame).skip_mode_info.skip_mode_flag != 0) && (bVar25 == 0)) {
    bVar18 = block_size_high[uVar22];
    if (block_size_wide[uVar22] < block_size_high[uVar22]) {
      bVar18 = block_size_wide[uVar22];
    }
    if (7 < bVar18) {
      pMVar9 = (td->mb).e_mbd.left_mbmi;
      pMVar10 = (td->mb).e_mbd.above_mbmi;
      if (pMVar10 == (MB_MODE_INFO *)0x0) {
        uVar17 = 0;
      }
      else {
        uVar17 = (ulong)(*(ushort *)&pMVar10->field_0xa7 >> 6 & 1);
      }
      if (pMVar9 == (MB_MODE_INFO *)0x0) {
        uVar21 = 0;
      }
      else {
        uVar21 = (ulong)(*(ushort *)&pMVar9->field_0xa7 >> 6 & 1);
      }
      paaVar31 = fc->skip_mode_cdfs + uVar21 + uVar17;
      uVar4 = (*paaVar31)[2];
      bVar18 = (char)(uVar4 >> 4) + 4;
      uVar5 = (*paaVar31)[0];
      if ((mbmi->field_0xa7 & 0x40) == 0) {
        sVar13 = -(uVar5 >> (bVar18 & 0x1f));
      }
      else {
        sVar13 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar18 & 0x1f));
      }
      (*paaVar31)[0] = uVar5 + sVar13;
      (*paaVar31)[2] = (*paaVar31)[2] + (ushort)(uVar4 < 0x20);
    }
  }
  if (((byte)mbmi->field_0xa7 >> 6 & 1) == 0 && bVar25 == 0) {
    pMVar9 = (td->mb).e_mbd.left_mbmi;
    pMVar10 = (td->mb).e_mbd.above_mbmi;
    if (pMVar10 == (MB_MODE_INFO *)0x0) {
      uVar17 = 0;
    }
    else {
      uVar17 = (ulong)pMVar10->skip_txfm;
    }
    if (pMVar9 == (MB_MODE_INFO *)0x0) {
      uVar21 = 0;
    }
    else {
      uVar21 = (ulong)pMVar9->skip_txfm;
    }
    paaVar31 = fc->skip_txfm_cdfs + uVar21 + uVar17;
    uVar4 = (*paaVar31)[2];
    bVar18 = (char)(uVar4 >> 4) + 4;
    uVar5 = (*paaVar31)[0];
    if ((char)mbmi->skip_txfm < '\x01') {
      sVar13 = -(uVar5 >> (bVar18 & 0x1f));
    }
    else {
      sVar13 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar18 & 0x1f));
    }
    (*paaVar31)[0] = sVar13 + uVar5;
    (*paaVar31)[2] = (*paaVar31)[2] + (ushort)(uVar4 < 0x20);
  }
  xd = &(td->mb).e_mbd;
  if (((mbmi->field_0xa7 & 0x80) == 0) && (mbmi->ref_frame[0] < '\x01')) {
    av1_sum_intra_stats(cm,td->counts,xd,mbmi,(td->mb).e_mbd.above_mbmi,(td->mb).e_mbd.left_mbmi,
                        (uint)(((cm->current_frame).frame_type & 0xfd) == 0));
  }
  if (((((cm->current_frame).frame_type & 0xfd) == 0) &&
      ((cm->features).allow_screen_content_tools == true)) &&
     ((cm->features).allow_intrabc != false)) {
    uVar4 = *(ushort *)&mbmi->field_0xa7;
    uVar5 = fc->intrabc_cdf[2];
    bVar18 = (char)(uVar5 >> 4) + 4;
    uVar6 = fc->intrabc_cdf[0];
    if ((uVar4 >> 7 & 1) == 0) {
      sVar13 = -(uVar6 >> (bVar18 & 0x1f));
    }
    else {
      sVar13 = (short)((int)(0x8000 - (uint)uVar6) >> (bVar18 & 0x1f));
    }
    fc->intrabc_cdf[0] = uVar6 + sVar13;
    fc->intrabc_cdf[2] = fc->intrabc_cdf[2] + (ushort)(uVar5 < 0x20);
    if ((uVar4 >> 7 & 1) != 0) {
      cVar29 = mbmi->ref_frame[0];
      cVar2 = mbmi->ref_frame[1];
      if ('\0' < cVar2) {
        cVar28 = -1;
        if (cVar2 < '\x05' || '\x04' < cVar29) {
          lVar30 = 0;
          do {
            if ((cVar29 == (&comp_ref0_lut)[lVar30]) && (cVar2 == (&comp_ref1_lut)[lVar30])) {
              cVar28 = (char)lVar30;
              break;
            }
            lVar30 = lVar30 + 1;
          } while (lVar30 != 9);
        }
        if (cVar28 < '\0') {
          cVar29 = cVar2 * '\x04' + cVar29 + -0xd;
        }
        else {
          cVar29 = cVar28 + '\x14';
        }
      }
      local_54 = *(int_mv *)((td->mb).mbmi_ext.ref_mv_stack + cVar29);
      local_40 = uVar22;
      av1_update_mv_stats(&mbmi->mv[0].as_mv,&local_54.as_mv,&fc->ndvc,-1);
      uVar22 = local_40;
    }
  }
  if (((cm->current_frame).frame_type & 0xfd) == 0) {
    return;
  }
  if ((*(ushort *)&mbmi->field_0xa7 & 0x40) != 0) {
    return;
  }
  if ((char)*(ushort *)&mbmi->field_0xa7 < '\0') {
    bVar33 = false;
  }
  else {
    bVar33 = mbmi->ref_frame[0] < '\x01';
  }
  local_38 = td->counts;
  if (bVar25 == 0) {
    iVar15 = av1_get_intra_inter_context(xd);
    paaVar31 = fc->intra_inter_cdf + iVar15;
    uVar4 = (*paaVar31)[2];
    bVar25 = (char)(uVar4 >> 4) + 4;
    uVar5 = (*paaVar31)[0];
    if (bVar33) {
      sVar13 = -(uVar5 >> (bVar25 & 0x1f));
    }
    else {
      sVar13 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar25 & 0x1f));
    }
    (*paaVar31)[0] = uVar5 + sVar13;
    (*paaVar31)[2] = (*paaVar31)[2] + (ushort)(uVar4 < 0x20);
    if (bVar33) {
      return;
    }
    cVar29 = mbmi->ref_frame[0];
    uVar32 = CONCAT71((int7)((ulong)fc >> 8),cVar29);
    uVar26 = CONCAT71(uVar27,mbmi->ref_frame[1]);
    if ((cm->current_frame).reference_mode == '\x02') {
      bVar25 = block_size_high[uVar22];
      if (block_size_wide[uVar22] < block_size_high[uVar22]) {
        bVar25 = block_size_wide[uVar22];
      }
      if (7 < bVar25) {
        pFVar11 = (td->mb).e_mbd.tile_ctx;
        local_50 = uVar26;
        iVar15 = av1_get_reference_mode_context(xd);
        uVar26 = local_50;
        update_cdf(pFVar11->comp_inter_cdf[iVar15],'\0' < mbmi->ref_frame[1],2);
      }
    }
    if (mbmi->ref_frame[1] < '\x01') {
      pFVar11 = (td->mb).e_mbd.tile_ctx;
      local_48 = uVar32;
      iVar15 = av1_get_pred_context_single_ref_p1(xd);
      uVar26 = local_48;
      update_cdf((aom_cdf_prob *)(pFVar11->single_ref_cdf + iVar15),'\x04' < cVar29,2);
      cVar29 = (char)uVar26;
      if (cVar29 < '\x05') {
        iVar15 = (int)uVar26 + -3;
        local_50 = CONCAT44(local_50._4_4_,iVar15);
        pFVar11 = (td->mb).e_mbd.tile_ctx;
        iVar14 = av1_get_pred_context_single_ref_p3(xd);
        update_cdf(pFVar11->single_ref_cdf[iVar14][2],(byte)iVar15 < 0xfe,2);
        pFVar11 = (td->mb).e_mbd.tile_ctx;
        if ((byte)local_50 < 0xfe) {
          iVar15 = av1_get_pred_context_single_ref_p5(xd);
          lVar30 = (long)iVar15 * 0x24 + 0x18;
          bVar33 = (char)local_48 == '\x03';
        }
        else {
          iVar15 = av1_get_pred_context_single_ref_p4(xd);
          lVar30 = (long)iVar15 * 0x24 + 0x12;
          bVar33 = (char)local_48 == '\x01';
        }
        paaVar31 = (aom_cdf_prob (*) [3])((long)pFVar11->single_ref_cdf[0][0] + lVar30);
        bVar33 = !bVar33;
LAB_001f13f0:
        update_cdf(*paaVar31,bVar33,2);
      }
      else {
        pFVar11 = (td->mb).e_mbd.tile_ctx;
        iVar15 = av1_get_pred_context_single_ref_p2(xd);
        update_cdf(pFVar11->single_ref_cdf[iVar15][1],cVar29 == '\a',2);
        if (cVar29 != '\a') {
          pFVar11 = (td->mb).e_mbd.tile_ctx;
          iVar15 = av1_get_pred_context_single_ref_p6(xd);
          paaVar31 = pFVar11->single_ref_cdf[iVar15] + 5;
          goto LAB_001f1007;
        }
      }
    }
    else {
      bVar33 = mbmi->ref_frame[1] < '\x05' == '\x04' < mbmi->ref_frame[0];
      local_50 = uVar26;
      iVar15 = av1_get_comp_reference_type_context(xd);
      pFVar11 = (td->mb).e_mbd.tile_ctx;
      uVar4 = pFVar11->comp_ref_type_cdf[iVar15][2];
      bVar25 = (char)(uVar4 >> 4) + 4;
      uVar5 = pFVar11->comp_ref_type_cdf[iVar15][0];
      if (bVar33) {
        sVar13 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar25 & 0x1f));
      }
      else {
        sVar13 = -(uVar5 >> (bVar25 & 0x1f));
      }
      pFVar11->comp_ref_type_cdf[iVar15][0] = uVar5 + sVar13;
      paVar1 = pFVar11->comp_ref_type_cdf[iVar15] + 2;
      *paVar1 = *paVar1 + (ushort)(uVar4 < 0x20);
      if (bVar33) {
        local_48 = uVar32;
        iVar15 = av1_get_pred_context_comp_ref_p(xd);
        update_cdf((aom_cdf_prob *)(((td->mb).e_mbd.tile_ctx)->comp_ref_cdf + iVar15),
                   (byte)(cVar29 - 3U) < 2,2);
        if ((byte)(cVar29 - 3U) < 2) {
          bVar33 = (char)local_48 == '\x04';
          iVar15 = av1_get_pred_context_comp_ref_p2(xd);
          paaVar31 = ((td->mb).e_mbd.tile_ctx)->comp_ref_cdf[iVar15] + 2;
        }
        else {
          iVar15 = av1_get_pred_context_comp_ref_p1(xd);
          paaVar31 = ((td->mb).e_mbd.tile_ctx)->comp_ref_cdf[iVar15] + 1;
          bVar33 = (char)local_48 == '\x02';
        }
        update_cdf(*paaVar31,bVar33,2);
        iVar15 = av1_get_pred_context_comp_bwdref_p(xd);
        uVar26 = local_50;
        cVar29 = (char)local_50;
        update_cdf((aom_cdf_prob *)(((td->mb).e_mbd.tile_ctx)->comp_bwdref_cdf + iVar15),
                   cVar29 == '\a',2);
        if (cVar29 != '\a') {
          iVar15 = av1_get_pred_context_comp_bwdref_p1(xd);
          paaVar31 = ((td->mb).e_mbd.tile_ctx)->comp_bwdref_cdf[iVar15] + 1;
LAB_001f1007:
          bVar33 = (char)uVar26 == '\x06';
          goto LAB_001f13f0;
        }
      }
      else {
        iVar15 = av1_get_pred_context_uni_comp_ref_p(xd);
        update_cdf((aom_cdf_prob *)(((td->mb).e_mbd.tile_ctx)->uni_comp_ref_cdf + iVar15),
                   cVar29 == '\x05',2);
        if (cVar29 != '\x05') {
          bVar25 = (char)local_50 - 3;
          iVar15 = av1_get_pred_context_uni_comp_ref_p1(xd);
          uVar26 = local_50;
          update_cdf(((td->mb).e_mbd.tile_ctx)->uni_comp_ref_cdf[iVar15][1],bVar25 < 2,2);
          if (bVar25 < 2) {
            bVar33 = (char)uVar26 == '\x04';
            iVar15 = av1_get_pred_context_uni_comp_ref_p2(xd);
            paaVar31 = ((td->mb).e_mbd.tile_ctx)->uni_comp_ref_cdf[iVar15] + 2;
            goto LAB_001f13f0;
          }
        }
      }
    }
    iVar15 = (int)uVar22;
    if (((cm->seq_params->enable_interintra_compound != '\0') &&
        (0xf8 < (byte)(mbmi->bsize - BLOCK_32X64))) &&
       ((0xfb < (byte)(mbmi->mode - 0x11) &&
        (('\0' < mbmi->ref_frame[0] && (mbmi->ref_frame[1] < '\x01')))))) {
      bVar25 = ""[uVar22];
      if (mbmi->ref_frame[1] == '\0') {
        update_cdf(fc->interintra_cdf[bVar25],'\x01',2);
        update_cdf(fc->interintra_mode_cdf[bVar25],mbmi->interintra_mode,4);
        if ((0 < *(int *)((long)&av1_wedge_params_lookup[0].wedge_types + (ulong)(uint)(iVar15 << 5)
                         )) &&
           (update_cdf(fc->wedge_interintra_cdf[uVar22],
                       (byte)((ushort)*(undefined2 *)&mbmi->field_0xa7 >> 10) & 1,2),
           (mbmi->field_0xa8 & 4) != 0)) {
          update_cdf((aom_cdf_prob *)
                     ((long)fc->wedge_idx_cdf[0] + (ulong)(uint)(iVar15 << 5) + uVar22 * 2),
                     mbmi->interintra_wedge_index,0x10);
        }
      }
      else {
        update_cdf(fc->interintra_cdf[bVar25],'\0',2);
      }
    }
    iVar14 = 0;
    if (((cm->features).switchable_motion_mode == true) && (mbmi->overlappable_neighbors != '\0')) {
      iVar7 = (td->mb).e_mbd.cur_frame_force_integer_mv;
      if (iVar7 == 0) {
        bVar25 = block_size_high[mbmi->bsize];
        if (block_size_wide[mbmi->bsize] < block_size_high[mbmi->bsize]) {
          bVar25 = block_size_wide[mbmi->bsize];
        }
        if (((1 < (td->mb).e_mbd.global_motion[mbmi->ref_frame[0]].wmtype) &&
            ((mbmi->mode - 0xf & 0xf7) == 0)) && (7 < bVar25)) goto LAB_001f151b;
      }
      bVar25 = block_size_high[mbmi->bsize];
      if (block_size_wide[mbmi->bsize] < block_size_high[mbmi->bsize]) {
        bVar25 = block_size_wide[mbmi->bsize];
      }
      if (((7 < bVar25) && (iVar14 = 0, 0xf3 < (byte)(mbmi->mode - 0x19))) &&
         (iVar14 = 0, mbmi->ref_frame[1] < '\0')) {
        if (((iVar7 == 0) && ((cm->features).allow_warped_motion != false)) &&
           (mbmi->num_proj_ref != '\0')) {
          psVar12 = (td->mb).e_mbd.block_ref_scale_factors[0];
          iVar7 = psVar12->x_scale_fp;
          iVar14 = 2;
          if (((iVar7 == -1) || (iVar8 = psVar12->y_scale_fp, iVar8 == -1)) ||
             (iVar8 == 0x4000 && iVar7 == 0x4000)) goto LAB_001f151b;
        }
        iVar14 = 1;
      }
    }
LAB_001f151b:
    if (mbmi->ref_frame[1] != '\0') {
      if (iVar14 == 1) {
        lVar30 = uVar22 * 6 + 0x2574;
        val = mbmi->motion_mode == '\x01';
        iVar14 = 2;
      }
      else {
        if (iVar14 != 2) goto LAB_001f156e;
        lVar30 = uVar22 * 8 + 0x24c4;
        val = mbmi->motion_mode;
        iVar14 = 3;
      }
      update_cdf((aom_cdf_prob *)((long)fc->txb_skip_cdf[0][0] + lVar30),val,iVar14);
    }
LAB_001f156e:
    if ('\0' < mbmi->ref_frame[1]) {
      bVar25 = block_size_high[uVar22];
      if (block_size_wide[uVar22] < block_size_high[uVar22]) {
        bVar25 = block_size_wide[uVar22];
      }
      if (7 < bVar25) {
        uVar20 = 0;
        do {
          if (1 < uVar20) {
            if ((char)uVar20 == '\x02') {
              if (0 < *(int *)((long)&av1_wedge_params_lookup[0].wedge_types +
                              (ulong)(uint)(iVar15 << 5))) goto LAB_001f15d7;
            }
            else if (((uVar20 & 0xff) < 2) || ((uVar20 & 0xff) == 3)) {
LAB_001f15d7:
              if (cm->seq_params->enable_masked_compound != '\0') {
                uVar20 = get_comp_group_idx_context(xd);
                update_cdf(fc->comp_group_idx_cdf[uVar20],mbmi->field_0xa8 & 1,2);
              }
              break;
            }
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != 4);
      }
      uVar4 = *(ushort *)&mbmi->field_0xa7;
      if ((uVar4 >> 8 & 1) == 0) {
        uVar20 = get_comp_index_context(cm,xd);
        lVar30 = (ulong)uVar20 * 6 + 0x2e04;
        bVar25 = (byte)(uVar4 >> 9) & 1;
      }
      else {
        if ((bVar25 < 8) ||
           (*(int *)((long)&av1_wedge_params_lookup[0].wedge_types + (ulong)(uint)(iVar15 << 5)) < 1
           )) goto LAB_001f16a2;
        lVar30 = uVar22 * 6 + 0x2090;
        bVar25 = (mbmi->interinter_comp).type - 2;
      }
      update_cdf((aom_cdf_prob *)((long)fc->txb_skip_cdf[0][0] + lVar30),bVar25,2);
    }
LAB_001f16a2:
    bVar33 = false;
    if ((mbmi->interinter_comp).type == '\x02') {
      bVar25 = block_size_high[uVar22];
      if (block_size_wide[uVar22] < block_size_high[uVar22]) {
        bVar25 = block_size_wide[uVar22];
      }
      if ((7 < bVar25) &&
         (0 < *(int *)((long)&av1_wedge_params_lookup[0].wedge_types + (ulong)(uint)(iVar15 << 5))))
      {
        update_cdf((aom_cdf_prob *)
                   ((long)fc->wedge_idx_cdf[0] + (ulong)(uint)(iVar15 << 5) + uVar22 * 2),
                   (mbmi->interinter_comp).wedge_index,0x10);
        bVar33 = false;
      }
    }
  }
  if (bVar33) {
    return;
  }
  if ((((cm->features).interp_filter == MULTITAP_SHARP2) &&
      (pMVar9 = *(td->mb).e_mbd.mi, (pMVar9->field_0xa7 & 0x40) == 0)) &&
     (pMVar9->motion_mode != '\x02')) {
    if ((pMVar9->mode == '\x17') || (pMVar9->mode == '\x0f')) {
      bVar25 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
               [pMVar9->bsize];
      if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [pMVar9->bsize] <
          "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [pMVar9->bsize]) {
        bVar25 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [pMVar9->bsize];
      }
      if (1 < bVar25) {
        lVar30 = 0;
        do {
          if ((td->mb).e_mbd.global_motion[pMVar9->ref_frame[lVar30]].wmtype == '\x01')
          goto LAB_001f0a4c;
        } while (('\0' < pMVar9->ref_frame[1]) &&
                (bVar33 = lVar30 == 0, lVar30 = lVar30 + 1, bVar33));
        goto LAB_001f0afa;
      }
    }
LAB_001f0a4c:
    uVar3 = cm->seq_params->enable_dual_filter;
    iVar15 = 0;
    do {
      if (uVar3 == '\0' && iVar15 != 0) break;
      iVar14 = av1_get_pred_context_switchable_interp(xd,iVar15);
      uVar20 = (mbmi->interp_filters).as_int >> 0x10;
      if (iVar15 == 0) {
        uVar20 = (mbmi->interp_filters).as_int;
      }
      pFVar11 = (td->mb).e_mbd.tile_ctx;
      uVar4 = pFVar11->switchable_interp_cdf[iVar14][3];
      bVar25 = (char)(uVar4 >> 4) + 4;
      lVar30 = 0;
      do {
        uVar5 = pFVar11->switchable_interp_cdf[iVar14][lVar30];
        if (lVar30 < (char)uVar20) {
          sVar13 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar25 & 0x1f));
        }
        else {
          sVar13 = -(uVar5 >> (bVar25 & 0x1f));
        }
        pFVar11->switchable_interp_cdf[iVar14][lVar30] = sVar13 + uVar5;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 2);
      paVar1 = pFVar11->switchable_interp_cdf[iVar14] + 3;
      *paVar1 = *paVar1 + (ushort)(uVar4 < 0x20);
      bVar33 = iVar15 == 0;
      iVar15 = iVar15 + 1;
    } while (bVar33);
  }
LAB_001f0afa:
  if (((cm->seg).enabled != '\0') &&
     (((cm->seg).feature_mask[*(ushort *)&mbmi->field_0xa7 & 7] & 0x40) != 0)) {
    return;
  }
  cVar29 = mbmi->ref_frame[0];
  cVar2 = mbmi->ref_frame[1];
  if ('\0' < cVar2) {
    cVar28 = -1;
    if (cVar2 < '\x05' || '\x04' < cVar29) {
      lVar30 = 0;
      do {
        if ((cVar29 == (&comp_ref0_lut)[lVar30]) && (cVar2 == (&comp_ref1_lut)[lVar30])) {
          cVar28 = (char)lVar30;
          break;
        }
        lVar30 = lVar30 + 1;
      } while (lVar30 != 9);
    }
    if (cVar28 < '\0') {
      cVar29 = cVar2 * '\x04' + cVar29 + -0xd;
    }
    else {
      cVar29 = cVar28 + '\x14';
    }
  }
  puVar23 = (uint16_t *)((td->mb).mbmi_ext.mode_context + cVar29);
  if ('\0' < cVar2) {
    uVar20 = *puVar23 & 7;
    uVar22 = 4;
    if ((ushort)uVar20 < 4) {
      uVar22 = (ulong)uVar20;
    }
    puVar23 = compound_mode_ctx_map[*puVar23 >> 5 & 7] + uVar22;
  }
  if (mbmi->ref_frame[1] < '\x01') {
    av1_update_inter_mode_stats(fc,local_38,mbmi->mode,*puVar23);
  }
  else {
    update_cdf(fc->inter_compound_mode_cdf[(short)*puVar23],mbmi->mode + 0xef,8);
  }
  bVar25 = mbmi->mode;
  if (0x18 < bVar25) {
    return;
  }
  uVar20 = (uint)bVar25;
  if ((0x644000U >> (bVar25 & 0x1f) & 1) == 0) {
    if ((0x180000U >> (uVar20 & 0x1f) & 1) != 0) goto LAB_001f12e2;
    if ((0x1010000U >> (uVar20 & 0x1f) & 1) == 0) {
      return;
    }
    bVar18 = av1_ref_frame_type(mbmi->ref_frame);
    uVar22 = 0;
    do {
      while (uVar17 = uVar22 + 1, uVar17 < (td->mb).mbmi_ext.ref_mv_count[bVar18]) {
        if ((td->mb).mbmi_ext.weight[bVar18][uVar22] < 0x280) {
          uVar21 = (ulong)((uint)((td->mb).mbmi_ext.weight[bVar18][uVar22 + 1] < 0x280) * 2);
        }
        else {
          uVar21 = (ulong)((td->mb).mbmi_ext.weight[bVar18][uVar22 + 1] < 0x280);
        }
        uVar4 = fc->drl_cdf[uVar21][2];
        bVar19 = (char)(uVar4 >> 4) + 4;
        uVar5 = fc->drl_cdf[uVar21][0];
        if (uVar22 == (*(ushort *)&mbmi->field_0xa7 >> 4 & 3)) {
          sVar13 = -(uVar5 >> (bVar19 & 0x1f));
        }
        else {
          sVar13 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar19 & 0x1f));
        }
        fc->drl_cdf[uVar21][0] = uVar5 + sVar13;
        paVar1 = fc->drl_cdf[uVar21] + 2;
        *paVar1 = *paVar1 + (ushort)(uVar4 < 0x20);
        if ((uVar22 != 0) || (uVar22 = uVar17, (*(ushort *)&mbmi->field_0xa7 & 0x30) == 0))
        goto LAB_001f11c2;
      }
      bVar33 = uVar22 == 0;
      uVar22 = uVar17;
    } while (bVar33);
LAB_001f11c2:
    if (0x18 < uVar20) {
      return;
    }
    if ((0x644000U >> (uVar20 & 0x1f) & 1) != 0) goto LAB_001f11df;
    uVar16 = 0x1190000;
  }
  else {
LAB_001f11df:
    bVar18 = av1_ref_frame_type(mbmi->ref_frame);
    uVar22 = 0;
    do {
      while (uVar17 = uVar22 + 1, uVar22 + 2 < (ulong)(td->mb).mbmi_ext.ref_mv_count[bVar18]) {
        if ((td->mb).mbmi_ext.weight[bVar18][uVar22 + 1] < 0x280) {
          uVar21 = (ulong)((uint)((td->mb).mbmi_ext.weight[bVar18][uVar22 + 2] < 0x280) * 2);
        }
        else {
          uVar21 = (ulong)((td->mb).mbmi_ext.weight[bVar18][uVar22 + 2] < 0x280);
        }
        uVar4 = fc->drl_cdf[uVar21][2];
        bVar19 = (char)(uVar4 >> 4) + 4;
        uVar5 = fc->drl_cdf[uVar21][0];
        if (uVar22 == (*(ushort *)&mbmi->field_0xa7 >> 4 & 3)) {
          sVar13 = -(uVar5 >> (bVar19 & 0x1f));
        }
        else {
          sVar13 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar19 & 0x1f));
        }
        fc->drl_cdf[uVar21][0] = uVar5 + sVar13;
        paVar1 = fc->drl_cdf[uVar21] + 2;
        *paVar1 = *paVar1 + (ushort)(uVar4 < 0x20);
        if ((uVar22 == (*(ushort *)&mbmi->field_0xa7 >> 4 & 3)) || (uVar22 = uVar17, 1 < uVar17))
        goto LAB_001f12cb;
      }
      uVar22 = uVar17;
    } while (uVar17 < 2);
LAB_001f12cb:
    if (0x18 < bVar25) {
      return;
    }
    uVar16 = 0x1790000;
  }
  if ((uVar16 >> (bVar25 & 0x1f) & 1) == 0) {
    return;
  }
LAB_001f12e2:
  precision = -1;
  if ((cm->features).cur_frame_force_integer_mv == false) {
    precision = (cm->features).allow_high_precision_mv;
  }
  if (uVar20 < 0x19) {
    if ((0x280000U >> (uVar20 & 0x1f) & 1) == 0) {
      if ((0x500000U >> (uVar20 & 0x1f) & 1) == 0) {
        if ((0x1010000U >> (uVar20 & 0x1f) & 1) == 0) {
          return;
        }
        pMVar24 = (MV *)mbmi->mv;
        iVar15 = 0;
        do {
          local_54 = av1_get_ref_mv(&td->mb,iVar15);
          av1_update_mv_stats(pMVar24,&local_54.as_mv,&fc->nmvc,precision);
          if (iVar15 != 0) {
            return;
          }
          iVar15 = 1;
          pMVar24 = pMVar24 + 1;
        } while ('\0' < mbmi->ref_frame[1]);
        return;
      }
      local_54 = av1_get_ref_mv(&td->mb,0);
      pMVar24 = (MV *)mbmi->mv;
    }
    else {
      local_54 = av1_get_ref_mv(&td->mb,1);
      pMVar24 = (MV *)(mbmi->mv + 1);
    }
    av1_update_mv_stats(pMVar24,&local_54.as_mv,&fc->nmvc,precision);
  }
  return;
}

Assistant:

static void update_stats(const AV1_COMMON *const cm, ThreadData *td) {
  MACROBLOCK *x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  const CurrentFrame *const current_frame = &cm->current_frame;
  const BLOCK_SIZE bsize = mbmi->bsize;
  FRAME_CONTEXT *fc = xd->tile_ctx;
  const int seg_ref_active =
      segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_REF_FRAME);

  if (current_frame->skip_mode_info.skip_mode_flag && !seg_ref_active &&
      is_comp_ref_allowed(bsize)) {
    const int skip_mode_ctx = av1_get_skip_mode_context(xd);
#if CONFIG_ENTROPY_STATS
    td->counts->skip_mode[skip_mode_ctx][mbmi->skip_mode]++;
#endif
    update_cdf(fc->skip_mode_cdfs[skip_mode_ctx], mbmi->skip_mode, 2);
  }

  if (!mbmi->skip_mode && !seg_ref_active) {
    const int skip_ctx = av1_get_skip_txfm_context(xd);
#if CONFIG_ENTROPY_STATS
    td->counts->skip_txfm[skip_ctx][mbmi->skip_txfm]++;
#endif
    update_cdf(fc->skip_txfm_cdfs[skip_ctx], mbmi->skip_txfm, 2);
  }

#if CONFIG_ENTROPY_STATS
  // delta quant applies to both intra and inter
  const int super_block_upper_left =
      ((xd->mi_row & (cm->seq_params->mib_size - 1)) == 0) &&
      ((xd->mi_col & (cm->seq_params->mib_size - 1)) == 0);
  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
  if (delta_q_info->delta_q_present_flag &&
      (bsize != cm->seq_params->sb_size || !mbmi->skip_txfm) &&
      super_block_upper_left) {
    const int dq = (mbmi->current_qindex - xd->current_base_qindex) /
                   delta_q_info->delta_q_res;
    const int absdq = abs(dq);
    for (int i = 0; i < AOMMIN(absdq, DELTA_Q_SMALL); ++i) {
      td->counts->delta_q[i][1]++;
    }
    if (absdq < DELTA_Q_SMALL) td->counts->delta_q[absdq][0]++;
    if (delta_q_info->delta_lf_present_flag) {
      if (delta_q_info->delta_lf_multi) {
        const int frame_lf_count =
            av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
        for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
          const int delta_lf = (mbmi->delta_lf[lf_id] - xd->delta_lf[lf_id]) /
                               delta_q_info->delta_lf_res;
          const int abs_delta_lf = abs(delta_lf);
          for (int i = 0; i < AOMMIN(abs_delta_lf, DELTA_LF_SMALL); ++i) {
            td->counts->delta_lf_multi[lf_id][i][1]++;
          }
          if (abs_delta_lf < DELTA_LF_SMALL)
            td->counts->delta_lf_multi[lf_id][abs_delta_lf][0]++;
        }
      } else {
        const int delta_lf =
            (mbmi->delta_lf_from_base - xd->delta_lf_from_base) /
            delta_q_info->delta_lf_res;
        const int abs_delta_lf = abs(delta_lf);
        for (int i = 0; i < AOMMIN(abs_delta_lf, DELTA_LF_SMALL); ++i) {
          td->counts->delta_lf[i][1]++;
        }
        if (abs_delta_lf < DELTA_LF_SMALL)
          td->counts->delta_lf[abs_delta_lf][0]++;
      }
    }
  }
#endif

  if (!is_inter_block(mbmi)) {
    av1_sum_intra_stats(cm, td->counts, xd, mbmi, xd->above_mbmi, xd->left_mbmi,
                        frame_is_intra_only(cm));
  }

  if (av1_allow_intrabc(cm)) {
    const int is_intrabc = is_intrabc_block(mbmi);
    update_cdf(fc->intrabc_cdf, is_intrabc, 2);
#if CONFIG_ENTROPY_STATS
    ++td->counts->intrabc[is_intrabc];
#endif  // CONFIG_ENTROPY_STATS
    if (is_intrabc) {
      const int8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
      const int_mv dv_ref = mbmi_ext->ref_mv_stack[ref_frame_type][0].this_mv;
      av1_update_mv_stats(&mbmi->mv[0].as_mv, &dv_ref.as_mv, &fc->ndvc,
                          MV_SUBPEL_NONE);
    }
  }

  if (frame_is_intra_only(cm) || mbmi->skip_mode) return;

  FRAME_COUNTS *const counts = td->counts;
  const int inter_block = is_inter_block(mbmi);

  if (!seg_ref_active) {
#if CONFIG_ENTROPY_STATS
    counts->intra_inter[av1_get_intra_inter_context(xd)][inter_block]++;
#endif
    update_cdf(fc->intra_inter_cdf[av1_get_intra_inter_context(xd)],
               inter_block, 2);
    // If the segment reference feature is enabled we have only a single
    // reference frame allowed for the segment so exclude it from
    // the reference frame counts used to work out probabilities.
    if (inter_block) {
      const MV_REFERENCE_FRAME ref0 = mbmi->ref_frame[0];
      const MV_REFERENCE_FRAME ref1 = mbmi->ref_frame[1];
      if (current_frame->reference_mode == REFERENCE_MODE_SELECT) {
        if (is_comp_ref_allowed(bsize)) {
#if CONFIG_ENTROPY_STATS
          counts->comp_inter[av1_get_reference_mode_context(xd)]
                            [has_second_ref(mbmi)]++;
#endif  // CONFIG_ENTROPY_STATS
          update_cdf(av1_get_reference_mode_cdf(xd), has_second_ref(mbmi), 2);
        }
      }

      if (has_second_ref(mbmi)) {
        const COMP_REFERENCE_TYPE comp_ref_type = has_uni_comp_refs(mbmi)
                                                      ? UNIDIR_COMP_REFERENCE
                                                      : BIDIR_COMP_REFERENCE;
        update_cdf(av1_get_comp_reference_type_cdf(xd), comp_ref_type,
                   COMP_REFERENCE_TYPES);
#if CONFIG_ENTROPY_STATS
        counts->comp_ref_type[av1_get_comp_reference_type_context(xd)]
                             [comp_ref_type]++;
#endif  // CONFIG_ENTROPY_STATS

        if (comp_ref_type == UNIDIR_COMP_REFERENCE) {
          const int bit = (ref0 == BWDREF_FRAME);
          update_cdf(av1_get_pred_cdf_uni_comp_ref_p(xd), bit, 2);
#if CONFIG_ENTROPY_STATS
          counts
              ->uni_comp_ref[av1_get_pred_context_uni_comp_ref_p(xd)][0][bit]++;
#endif  // CONFIG_ENTROPY_STATS
          if (!bit) {
            const int bit1 = (ref1 == LAST3_FRAME || ref1 == GOLDEN_FRAME);
            update_cdf(av1_get_pred_cdf_uni_comp_ref_p1(xd), bit1, 2);
#if CONFIG_ENTROPY_STATS
            counts->uni_comp_ref[av1_get_pred_context_uni_comp_ref_p1(xd)][1]
                                [bit1]++;
#endif  // CONFIG_ENTROPY_STATS
            if (bit1) {
              update_cdf(av1_get_pred_cdf_uni_comp_ref_p2(xd),
                         ref1 == GOLDEN_FRAME, 2);
#if CONFIG_ENTROPY_STATS
              counts->uni_comp_ref[av1_get_pred_context_uni_comp_ref_p2(xd)][2]
                                  [ref1 == GOLDEN_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
            }
          }
        } else {
          const int bit = (ref0 == GOLDEN_FRAME || ref0 == LAST3_FRAME);
          update_cdf(av1_get_pred_cdf_comp_ref_p(xd), bit, 2);
#if CONFIG_ENTROPY_STATS
          counts->comp_ref[av1_get_pred_context_comp_ref_p(xd)][0][bit]++;
#endif  // CONFIG_ENTROPY_STATS
          if (!bit) {
            update_cdf(av1_get_pred_cdf_comp_ref_p1(xd), ref0 == LAST2_FRAME,
                       2);
#if CONFIG_ENTROPY_STATS
            counts->comp_ref[av1_get_pred_context_comp_ref_p1(xd)][1]
                            [ref0 == LAST2_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          } else {
            update_cdf(av1_get_pred_cdf_comp_ref_p2(xd), ref0 == GOLDEN_FRAME,
                       2);
#if CONFIG_ENTROPY_STATS
            counts->comp_ref[av1_get_pred_context_comp_ref_p2(xd)][2]
                            [ref0 == GOLDEN_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          }
          update_cdf(av1_get_pred_cdf_comp_bwdref_p(xd), ref1 == ALTREF_FRAME,
                     2);
#if CONFIG_ENTROPY_STATS
          counts->comp_bwdref[av1_get_pred_context_comp_bwdref_p(xd)][0]
                             [ref1 == ALTREF_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          if (ref1 != ALTREF_FRAME) {
            update_cdf(av1_get_pred_cdf_comp_bwdref_p1(xd),
                       ref1 == ALTREF2_FRAME, 2);
#if CONFIG_ENTROPY_STATS
            counts->comp_bwdref[av1_get_pred_context_comp_bwdref_p1(xd)][1]
                               [ref1 == ALTREF2_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          }
        }
      } else {
        const int bit = (ref0 >= BWDREF_FRAME);
        update_cdf(av1_get_pred_cdf_single_ref_p1(xd), bit, 2);
#if CONFIG_ENTROPY_STATS
        counts->single_ref[av1_get_pred_context_single_ref_p1(xd)][0][bit]++;
#endif  // CONFIG_ENTROPY_STATS
        if (bit) {
          assert(ref0 <= ALTREF_FRAME);
          update_cdf(av1_get_pred_cdf_single_ref_p2(xd), ref0 == ALTREF_FRAME,
                     2);
#if CONFIG_ENTROPY_STATS
          counts->single_ref[av1_get_pred_context_single_ref_p2(xd)][1]
                            [ref0 == ALTREF_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          if (ref0 != ALTREF_FRAME) {
            update_cdf(av1_get_pred_cdf_single_ref_p6(xd),
                       ref0 == ALTREF2_FRAME, 2);
#if CONFIG_ENTROPY_STATS
            counts->single_ref[av1_get_pred_context_single_ref_p6(xd)][5]
                              [ref0 == ALTREF2_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          }
        } else {
          const int bit1 = !(ref0 == LAST2_FRAME || ref0 == LAST_FRAME);
          update_cdf(av1_get_pred_cdf_single_ref_p3(xd), bit1, 2);
#if CONFIG_ENTROPY_STATS
          counts->single_ref[av1_get_pred_context_single_ref_p3(xd)][2][bit1]++;
#endif  // CONFIG_ENTROPY_STATS
          if (!bit1) {
            update_cdf(av1_get_pred_cdf_single_ref_p4(xd), ref0 != LAST_FRAME,
                       2);
#if CONFIG_ENTROPY_STATS
            counts->single_ref[av1_get_pred_context_single_ref_p4(xd)][3]
                              [ref0 != LAST_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          } else {
            update_cdf(av1_get_pred_cdf_single_ref_p5(xd), ref0 != LAST3_FRAME,
                       2);
#if CONFIG_ENTROPY_STATS
            counts->single_ref[av1_get_pred_context_single_ref_p5(xd)][4]
                              [ref0 != LAST3_FRAME]++;
#endif  // CONFIG_ENTROPY_STATS
          }
        }
      }

      if (cm->seq_params->enable_interintra_compound &&
          is_interintra_allowed(mbmi)) {
        const int bsize_group = size_group_lookup[bsize];
        if (mbmi->ref_frame[1] == INTRA_FRAME) {
#if CONFIG_ENTROPY_STATS
          counts->interintra[bsize_group][1]++;
#endif
          update_cdf(fc->interintra_cdf[bsize_group], 1, 2);
#if CONFIG_ENTROPY_STATS
          counts->interintra_mode[bsize_group][mbmi->interintra_mode]++;
#endif
          update_cdf(fc->interintra_mode_cdf[bsize_group],
                     mbmi->interintra_mode, INTERINTRA_MODES);
          if (av1_is_wedge_used(bsize)) {
#if CONFIG_ENTROPY_STATS
            counts->wedge_interintra[bsize][mbmi->use_wedge_interintra]++;
#endif
            update_cdf(fc->wedge_interintra_cdf[bsize],
                       mbmi->use_wedge_interintra, 2);
            if (mbmi->use_wedge_interintra) {
#if CONFIG_ENTROPY_STATS
              counts->wedge_idx[bsize][mbmi->interintra_wedge_index]++;
#endif
              update_cdf(fc->wedge_idx_cdf[bsize], mbmi->interintra_wedge_index,
                         16);
            }
          }
        } else {
#if CONFIG_ENTROPY_STATS
          counts->interintra[bsize_group][0]++;
#endif
          update_cdf(fc->interintra_cdf[bsize_group], 0, 2);
        }
      }

      const MOTION_MODE motion_allowed =
          cm->features.switchable_motion_mode
              ? motion_mode_allowed(xd->global_motion, xd, mbmi,
                                    cm->features.allow_warped_motion)
              : SIMPLE_TRANSLATION;
      if (mbmi->ref_frame[1] != INTRA_FRAME) {
        if (motion_allowed == WARPED_CAUSAL) {
#if CONFIG_ENTROPY_STATS
          counts->motion_mode[bsize][mbmi->motion_mode]++;
#endif
          update_cdf(fc->motion_mode_cdf[bsize], mbmi->motion_mode,
                     MOTION_MODES);
        } else if (motion_allowed == OBMC_CAUSAL) {
#if CONFIG_ENTROPY_STATS
          counts->obmc[bsize][mbmi->motion_mode == OBMC_CAUSAL]++;
#endif
          update_cdf(fc->obmc_cdf[bsize], mbmi->motion_mode == OBMC_CAUSAL, 2);
        }
      }

      if (has_second_ref(mbmi)) {
        assert(current_frame->reference_mode != SINGLE_REFERENCE &&
               is_inter_compound_mode(mbmi->mode) &&
               mbmi->motion_mode == SIMPLE_TRANSLATION);

        const int masked_compound_used = is_any_masked_compound_used(bsize) &&
                                         cm->seq_params->enable_masked_compound;
        if (masked_compound_used) {
          const int comp_group_idx_ctx = get_comp_group_idx_context(xd);
#if CONFIG_ENTROPY_STATS
          ++counts->comp_group_idx[comp_group_idx_ctx][mbmi->comp_group_idx];
#endif
          update_cdf(fc->comp_group_idx_cdf[comp_group_idx_ctx],
                     mbmi->comp_group_idx, 2);
        }

        if (mbmi->comp_group_idx == 0) {
          const int comp_index_ctx = get_comp_index_context(cm, xd);
#if CONFIG_ENTROPY_STATS
          ++counts->compound_index[comp_index_ctx][mbmi->compound_idx];
#endif
          update_cdf(fc->compound_index_cdf[comp_index_ctx], mbmi->compound_idx,
                     2);
        } else {
          assert(masked_compound_used);
          if (is_interinter_compound_used(COMPOUND_WEDGE, bsize)) {
#if CONFIG_ENTROPY_STATS
            ++counts->compound_type[bsize][mbmi->interinter_comp.type -
                                           COMPOUND_WEDGE];
#endif
            update_cdf(fc->compound_type_cdf[bsize],
                       mbmi->interinter_comp.type - COMPOUND_WEDGE,
                       MASKED_COMPOUND_TYPES);
          }
        }
      }
      if (mbmi->interinter_comp.type == COMPOUND_WEDGE) {
        if (is_interinter_compound_used(COMPOUND_WEDGE, bsize)) {
#if CONFIG_ENTROPY_STATS
          counts->wedge_idx[bsize][mbmi->interinter_comp.wedge_index]++;
#endif
          update_cdf(fc->wedge_idx_cdf[bsize],
                     mbmi->interinter_comp.wedge_index, 16);
        }
      }
    }
  }

  if (inter_block && cm->features.interp_filter == SWITCHABLE &&
      av1_is_interp_needed(xd)) {
    update_filter_type_cdf(xd, mbmi, cm->seq_params->enable_dual_filter);
  }
  if (inter_block &&
      !segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP)) {
    const PREDICTION_MODE mode = mbmi->mode;
    const int16_t mode_ctx =
        av1_mode_context_analyzer(mbmi_ext->mode_context, mbmi->ref_frame);
    if (has_second_ref(mbmi)) {
#if CONFIG_ENTROPY_STATS
      ++counts->inter_compound_mode[mode_ctx][INTER_COMPOUND_OFFSET(mode)];
#endif
      update_cdf(fc->inter_compound_mode_cdf[mode_ctx],
                 INTER_COMPOUND_OFFSET(mode), INTER_COMPOUND_MODES);
    } else {
      av1_update_inter_mode_stats(fc, counts, mode, mode_ctx);
    }

    const int new_mv = mbmi->mode == NEWMV || mbmi->mode == NEW_NEWMV;
    if (new_mv) {
      const uint8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
      for (int idx = 0; idx < 2; ++idx) {
        if (mbmi_ext->ref_mv_count[ref_frame_type] > idx + 1) {
          const uint8_t drl_ctx =
              av1_drl_ctx(mbmi_ext->weight[ref_frame_type], idx);
          update_cdf(fc->drl_cdf[drl_ctx], mbmi->ref_mv_idx != idx, 2);
#if CONFIG_ENTROPY_STATS
          ++counts->drl_mode[drl_ctx][mbmi->ref_mv_idx != idx];
#endif
          if (mbmi->ref_mv_idx == idx) break;
        }
      }
    }

    if (have_nearmv_in_inter_mode(mbmi->mode)) {
      const uint8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
      for (int idx = 1; idx < 3; ++idx) {
        if (mbmi_ext->ref_mv_count[ref_frame_type] > idx + 1) {
          const uint8_t drl_ctx =
              av1_drl_ctx(mbmi_ext->weight[ref_frame_type], idx);
          update_cdf(fc->drl_cdf[drl_ctx], mbmi->ref_mv_idx != idx - 1, 2);
#if CONFIG_ENTROPY_STATS
          ++counts->drl_mode[drl_ctx][mbmi->ref_mv_idx != idx - 1];
#endif
          if (mbmi->ref_mv_idx == idx - 1) break;
        }
      }
    }
    if (have_newmv_in_inter_mode(mbmi->mode)) {
      const int allow_hp = cm->features.cur_frame_force_integer_mv
                               ? MV_SUBPEL_NONE
                               : cm->features.allow_high_precision_mv;
      if (new_mv) {
        for (int ref = 0; ref < 1 + has_second_ref(mbmi); ++ref) {
          const int_mv ref_mv = av1_get_ref_mv(x, ref);
          av1_update_mv_stats(&mbmi->mv[ref].as_mv, &ref_mv.as_mv, &fc->nmvc,
                              allow_hp);
        }
      } else if (mbmi->mode == NEAREST_NEWMV || mbmi->mode == NEAR_NEWMV) {
        const int ref = 1;
        const int_mv ref_mv = av1_get_ref_mv(x, ref);
        av1_update_mv_stats(&mbmi->mv[ref].as_mv, &ref_mv.as_mv, &fc->nmvc,
                            allow_hp);
      } else if (mbmi->mode == NEW_NEARESTMV || mbmi->mode == NEW_NEARMV) {
        const int ref = 0;
        const int_mv ref_mv = av1_get_ref_mv(x, ref);
        av1_update_mv_stats(&mbmi->mv[ref].as_mv, &ref_mv.as_mv, &fc->nmvc,
                            allow_hp);
      }
    }
  }
}